

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O2

int XFastConvertUtf8ToUcs(uchar *buf,int len,uint *ucs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = *buf;
  uVar3 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) != 0) {
      uVar3 = (uint)bVar1;
      if ((bVar1 & 0x20) == 0) {
        if (1 < len) {
          uVar3 = (uVar3 & 0x1f) * 0x40 + (buf[1] & 0x7f);
          iVar2 = 2;
          goto LAB_00201f84;
        }
      }
      else if ((bVar1 & 0x10) == 0) {
        if (2 < len) {
          uVar3 = (buf[2] & 0x7f) + (buf[1] & 0x7f) * 0x40 + (bVar1 & 0xf) * 0x1000;
          iVar2 = 3;
          goto LAB_00201f84;
        }
      }
      else if ((bVar1 & 8) == 0) {
        if (3 < len) {
          uVar3 = (buf[3] & 0x7f) + (buf[2] & 0x7f) * 0x40 +
                  (buf[1] & 0x7f) * 0x1000 + (uVar3 & 7) * 0x40000;
          iVar2 = 4;
          goto LAB_00201f84;
        }
      }
      else if (4 < len && (char)((uVar3 & 4) >> 2) == '\0') {
        uVar3 = (buf[4] & 0x7f) +
                (buf[3] & 0x7f) * 0x40 + (buf[2] & 0x7f) * 0x1000 +
                (buf[1] & 0x7f) * 0x40000 + (uVar3 & 3) * 0x1000000;
        iVar2 = 5;
        goto LAB_00201f84;
      }
    }
  }
  else if (0 < len) {
    iVar2 = 1;
    goto LAB_00201f84;
  }
  iVar2 = -1;
  uVar3 = 0x3f;
LAB_00201f84:
  *ucs = uVar3;
  return iVar2;
}

Assistant:

int
XFastConvertUtf8ToUcs(const unsigned char     *buf,
		      int                     len,
		      unsigned int            *ucs) {

  if (buf[0] & 0x80) {
    if (buf[0] & 0x40) {
      if (buf[0] & 0x20) {
	if (buf[0] & 0x10) {
	  if (buf[0] & 0x08) {
	    if (buf[0] & 0x04) {
	      if (buf[0] & 0x02) {
		/* bad UTF-8 string */
	      } else {
		/* 0x04000000 - 0x7FFFFFFF */
	      }	
	    } else if (len > 4) {
	      /* 0x00200000 - 0x03FFFFFF */
	      *ucs =  ((buf[0] & ~0xF8) << 24) +
		      ((buf[1] & ~0x80) << 18) +
		      ((buf[2] & ~0x80) << 12) +
		      ((buf[3] & ~0x80) << 6) +
		       (buf[4] & ~0x80);
	      return 5;
	    }
	  } else if (len > 3) {
	    /* 0x00010000 - 0x001FFFFF */
	    *ucs =  ((buf[0] & ~0xF0) << 18) +
		    ((buf[1] & ~0x80) << 12) +
		    ((buf[2] & ~0x80) << 6) +
		     (buf[3] & ~0x80);
	    return 4;
	  }
	} else if (len > 2) {
	  /* 0x00000800 - 0x0000FFFF */
	  *ucs =  ((buf[0] & ~0xE0) << 12) +
		  ((buf[1] & ~0x80) << 6) +
		   (buf[2] & ~0x80);
	  return 3;
	}	
      } else if (len > 1) {
	/* 0x00000080 - 0x000007FF */
	*ucs = ((buf[0] & ~0xC0) << 6) +
		(buf[1] & ~0x80);
	return 2;
      }
    }
  } else if (len > 0) {
    /* 0x00000000 - 0x0000007F */
    *ucs = buf[0];
    return 1;
  } 

  *ucs = (unsigned int) '?'; /* bad utf-8 string */
  return -1;
}